

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cGPUShader5Tests.cpp
# Opt level: O0

void __thiscall
gl3cts::Utils::programInfo::setUniform
          (programInfo *this,_variable_type type,GLchar *name,GLvoid *data)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *pTVar5;
  GLint location;
  GLuint *u_data;
  GLint *i_data;
  GLfloat *f_data;
  Functions *gl;
  GLvoid *data_local;
  GLchar *name_local;
  _variable_type type_local;
  programInfo *this_local;
  long lVar4;
  
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  iVar1 = (**(code **)(lVar4 + 0xb48))(this->m_program_object_id,name);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"glGetUniformLocation() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                  ,0xfb);
  if (iVar1 != -1) {
    switch(type) {
    case VARIABLE_TYPE_FLOAT:
      (**(code **)(lVar4 + 0x14e8))(iVar1,1,data);
      break;
    case VARIABLE_TYPE_INT:
      (**(code **)(lVar4 + 0x14f8))(iVar1,1,data);
      break;
    case VARIABLE_TYPE_IVEC2:
      (**(code **)(lVar4 + 0x1538))(iVar1,1,data);
      break;
    case VARIABLE_TYPE_IVEC3:
      (**(code **)(lVar4 + 0x1578))(iVar1,1,data);
      break;
    case VARIABLE_TYPE_IVEC4:
      (**(code **)(lVar4 + 0x15b8))(iVar1,1,data);
      break;
    case VARIABLE_TYPE_UINT:
      (**(code **)(lVar4 + 0x1508))(iVar1,1,data);
      break;
    case VARIABLE_TYPE_UVEC2:
      (**(code **)(lVar4 + 0x1548))(iVar1,1,data);
      break;
    case VARIABLE_TYPE_UVEC3:
      (**(code **)(lVar4 + 0x1588))(iVar1,1,data);
      break;
    case VARIABLE_TYPE_UVEC4:
      (**(code **)(lVar4 + 0x15c8))(iVar1,1,data);
      break;
    case VARIABLE_TYPE_VEC2:
      (**(code **)(lVar4 + 0x1528))(iVar1,1,data);
      break;
    case VARIABLE_TYPE_VEC3:
      (**(code **)(lVar4 + 0x1568))(iVar1,1,data);
      break;
    case VARIABLE_TYPE_VEC4:
      (**(code **)(lVar4 + 0x15a8))(iVar1,1,data);
      break;
    default:
      pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar5,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                 ,0x12a);
      __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    dVar2 = (**(code **)(lVar4 + 0x800))();
    glu::checkError(dVar2,"Uniform",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
                    ,0x12e);
    return;
  }
  pTVar5 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar5,"Uniform variable is unavailable",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cGPUShader5Tests.cpp"
             ,0xff);
  __cxa_throw(pTVar5,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void Utils::programInfo::setUniform(Utils::_variable_type type, const glw::GLchar* name, const glw::GLvoid* data)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	const glw::GLfloat* f_data = (glw::GLfloat*)data;
	const glw::GLint*   i_data = (glw::GLint*)data;
	const glw::GLuint*  u_data = (glw::GLuint*)data;

	/* Get location */
	glw::GLint location = gl.getUniformLocation(m_program_object_id, name);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetUniformLocation() call failed.");

	if (-1 == location)
	{
		TCU_FAIL("Uniform variable is unavailable");
	}

	/* Set data */
	switch (type)
	{
	case Utils::VARIABLE_TYPE_FLOAT:
		gl.uniform1fv(location, 1, f_data);
		break;
	case Utils::VARIABLE_TYPE_INT:
		gl.uniform1iv(location, 1, i_data);
		break;
	case Utils::VARIABLE_TYPE_IVEC2:
		gl.uniform2iv(location, 1, i_data);
		break;
	case Utils::VARIABLE_TYPE_IVEC3:
		gl.uniform3iv(location, 1, i_data);
		break;
	case Utils::VARIABLE_TYPE_IVEC4:
		gl.uniform4iv(location, 1, i_data);
		break;
	case Utils::VARIABLE_TYPE_UINT:
		gl.uniform1uiv(location, 1, u_data);
		break;
	case Utils::VARIABLE_TYPE_UVEC2:
		gl.uniform2uiv(location, 1, u_data);
		break;
	case Utils::VARIABLE_TYPE_UVEC3:
		gl.uniform3uiv(location, 1, u_data);
		break;
	case Utils::VARIABLE_TYPE_UVEC4:
		gl.uniform4uiv(location, 1, u_data);
		break;
	case Utils::VARIABLE_TYPE_VEC2:
		gl.uniform2fv(location, 1, f_data);
		break;
	case Utils::VARIABLE_TYPE_VEC3:
		gl.uniform3fv(location, 1, f_data);
		break;
	case Utils::VARIABLE_TYPE_VEC4:
		gl.uniform4fv(location, 1, f_data);
		break;
	default:
		TCU_FAIL("Invalid enum");
		break;
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Uniform");
}